

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.cpp
# Opt level: O0

void SeedRandomStateForTest(SeedRand seedtype)

{
  int iVar1;
  long in_FS_OFFSET;
  string_view in_stack_00000000;
  string_view in_stack_00000010;
  uint256 *seed;
  char *RANDOM_CTX_SEED;
  Level in_stack_000000f0;
  char **in_stack_00000100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000108;
  undefined4 uVar2;
  undefined4 in_stack_ffffffffffffff4c;
  anon_class_1_0_00000001 *in_stack_ffffffffffffff60;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff68;
  LogFlags in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffbc;
  ConstevalFormatString<2U> fmt;
  
  fmt.fmt = *(char **)(in_FS_OFFSET + 0x28);
  if ((SeedRandomStateForTest(SeedRand)::ctx_seed == '\0') &&
     (iVar1 = __cxa_guard_acquire(&SeedRandomStateForTest(SeedRand)::ctx_seed), iVar1 != 0)) {
    SeedRandomStateForTest::anon_class_1_0_00000001::operator()(in_stack_ffffffffffffff60);
    __cxa_guard_release(&SeedRandomStateForTest(SeedRand)::ctx_seed);
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_ffffffffffffff68,(char *)in_stack_ffffffffffffff60);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_ffffffffffffff68,(char *)in_stack_ffffffffffffff60);
  base_blob<256u>::GetHex_abi_cxx11_((base_blob<256U> *)in_stack_ffffffffffffff60);
  uVar2 = 2;
  LogPrintFormatInternal<char_const*,std::__cxx11::string>
            (in_stack_00000010,in_stack_00000000,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb0
             ,in_stack_000000f0,fmt,in_stack_00000100,in_stack_00000108);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffff4c,uVar2));
  MakeRandDeterministicDANGEROUS((uint256 *)CONCAT44(in_stack_ffffffffffffff4c,uVar2));
  if (*(char **)(in_FS_OFFSET + 0x28) == fmt.fmt) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SeedRandomStateForTest(SeedRand seedtype)
{
    constexpr auto RANDOM_CTX_SEED{"RANDOM_CTX_SEED"};

    // Do this once, on the first call, regardless of seedtype, because once
    // MakeRandDeterministicDANGEROUS is called, the output of GetRandHash is
    // no longer truly random. It should be enough to get the seed once for the
    // process.
    static const uint256 ctx_seed = []() {
        // If RANDOM_CTX_SEED is set, use that as seed.
        if (const char* num{std::getenv(RANDOM_CTX_SEED)}) {
            if (auto num_parsed{uint256::FromUserHex(num)}) {
                return *num_parsed;
            } else {
                std::cerr << RANDOM_CTX_SEED << " must consist of up to " << uint256::size() * 2 << " hex digits (\"0x\" prefix allowed), it was set to: '" << num << "'.\n";
                std::abort();
            }
        }
        // Otherwise use a (truly) random value.
        return GetRandHash();
    }();

    const uint256& seed{seedtype == SeedRand::FIXED_SEED ? ctx_seed : uint256::ZERO};
    LogInfo("Setting random seed for current tests to %s=%s\n", RANDOM_CTX_SEED, seed.GetHex());
    MakeRandDeterministicDANGEROUS(seed);
}